

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::details::lifted_deleter<OpenMD::ConstraintElem*>(ConstraintElem *val)

{
  ConstraintElem *in_RDI;
  
  if (in_RDI != (ConstraintElem *)0x0) {
    ConstraintElem::~ConstraintElem(in_RDI);
    operator_delete(in_RDI,0x28);
  }
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }